

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

void init_ld_script(GlobalVars *gv)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  ObjectUnit *n;
  LinkedSection *ls;
  char *pcVar8;
  size_t sVar9;
  char *name;
  Phdr **ppPVar10;
  Phdr *pPVar11;
  lword len;
  lword lVar12;
  char *pcVar13;
  MemoryDescr *vmreg;
  Phdr **__ptr;
  MemoryDescr *lmreg;
  char *pcVar14;
  Phdr **ppPVar15;
  bool bVar16;
  lword s_lma;
  lword s_addr;
  char namebuf [256];
  Section *local_170;
  Phdr **local_168;
  char *local_150;
  lword local_148;
  lword local_140;
  undefined4 local_138;
  undefined3 uStack_134;
  
  if (gv->dest_object == 0) {
    scriptbase = gv->ldscript;
    if (scriptbase == (char *)0x0) {
      scriptbase = fff[gv->dest_format]->exeldscript;
    }
  }
  else if ((gv->dest_sharedobj != 0) && (scriptbase = gv->ldscript, scriptbase == (char *)0x0)) {
    scriptbase = fff[gv->dest_format]->soldscript;
  }
  if (scriptbase == (char *)0x0) {
    return;
  }
  preparse = 1;
  current_ls = (LinkedSection *)0x0;
  level = 0;
  defmem = add_memblock("default",0,0x7fffffffffffffff);
  vdefmem = defmem;
  ldefmem = defmem;
  atdefmem = add_memblock("lmadefault",0,0x7fffffffffffffff);
  change_address(defmem,gv->start_addr);
  scriptname = "built-in script";
  if (gv->scriptname != (char *)0x0) {
    scriptname = gv->scriptname;
  }
  snprintf((char *)&local_138,0x100,"Linker Script <%s>");
  pcVar7 = allocstring((char *)&local_138);
  n = art_objunit(gv,pcVar7,(uint8_t *)0x0,0);
  if (n != (ObjectUnit *)0x0) {
    n->flags = n->flags | 0x8001;
    addhead(&gv->selobjects,&n->n);
  }
  script_obj = n;
  init_parser(gv,scriptname,scriptbase,1);
LAB_00113771:
  do {
    do {
      do {
        bVar16 = false;
LAB_00113774:
        while( true ) {
          while (pcVar7 = getarg('\x01'), pcVar7 == (char *)0x0) {
            cVar1 = getchr();
            if (cVar1 != ';') {
              if (cVar1 != '\0') {
                back(1);
                pcVar7 = scriptname;
                uVar5 = getlineno();
                error(0x4e,pcVar7,(ulong)uVar5);
              }
              preparse = 0;
              return;
            }
          }
          iVar3 = strcmp(pcVar7,"MEMORY");
          if (iVar3 != 0) break;
          gv->use_ldscript = 1;
          if (!bVar16) {
            bVar4 = startofblock('{');
            if (bVar4 == 0) goto LAB_00113771;
            pcVar7 = getarg('\x01');
            goto joined_r0x00113e17;
          }
LAB_0011381c:
          pcVar7 = scriptname;
          uVar5 = getlineno();
          error(100,pcVar7,(ulong)uVar5);
          skipblock(0,'{','}');
          bVar16 = true;
        }
        iVar3 = strcmp(pcVar7,"PHDRS");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar7,"SECTIONS");
          if (iVar3 == 0) {
            gv->use_ldscript = 1;
            pcVar7 = scriptname;
            if (bVar16) {
              uVar5 = getlineno();
              error(0x4a,pcVar7,(ulong)uVar5);
            }
            if (gv->phdrlist == (Phdr *)0x0) {
              add_phdr(gv," text",1,0x45,-1,defmem,defmem);
              add_phdr(gv," data",1,0x46,-1,defmem,defmem);
            }
            level = 1;
            bVar4 = startofblock('{');
            if (bVar4 != 0) {
              skip();
              secblkbase = gettxtptr();
              secblkline = getlineno();
              local_168 = (Phdr **)0x0;
              do {
                while (pcVar7 = getarg('\x01'), pcVar7 != (char *)0x0) {
                  iVar3 = check_command(gv,pcVar7,0x8002);
                  if (iVar3 == 0) {
                    cVar1 = getchr();
                    if (cVar1 == '=') {
                      symbol_assignment(gv,pcVar7,'\0');
                    }
                    else {
                      back(1);
                      pcVar7 = allocstring(pcVar7);
                      uVar5 = startofsecdef(&local_140,(char *)&local_138,&local_148);
                      if (uVar5 == 0) {
                        free(pcVar7);
                        pcVar7 = scriptname;
                        uVar5 = getlineno();
                        error(0x41,pcVar7,(ulong)uVar5);
                      }
                      else {
                        ls = create_lnksect(gv,pcVar7,'\0','\0','\0','\0',0);
                        if (CONCAT31(uStack_134,local_138._3_1_) == 0x44414f &&
                            local_138 == 0x4f4c4f4e) {
                          *(byte *)&ls->ld_flags = (byte)ls->ld_flags | 1;
                        }
                        if (3 < uVar5) {
                          ls->destmem = atdefmem;
                        }
                        new_ls_name = ls->name;
                        level = 2;
                        local_170 = (Section *)0x0;
                        do {
                          while (pcVar8 = getarg('\x05'), pcVar8 != (char *)0x0) {
                            iVar3 = check_command(gv,pcVar8,0x8002);
                            if (iVar3 == 0) {
                              cVar1 = getchr();
                              pcVar13 = scriptname;
                              if (cVar1 == '=') {
                                symbol_assignment(gv,pcVar8,'\0');
                              }
                              else if (cVar1 == '(') {
                                if (local_170 == (Section *)0x0) {
                                  pcVar8 = getarg('\x05');
                                  if (pcVar8 == (char *)0x0) {
                                    ierror("make_dummy_sec_from_pattern(): no pattern?");
                                  }
                                  sVar9 = strlen(pcVar8);
                                  name = (char *)alloc(sVar9 + 1);
                                  pcVar13 = name;
                                  while( true ) {
                                    do {
                                      pcVar14 = pcVar8;
                                      cVar1 = *pcVar14;
                                      pcVar8 = pcVar14 + 1;
                                    } while (cVar1 == '*');
                                    if (cVar1 == '\0') break;
                                    if (cVar1 == '[') {
                                      cVar1 = *pcVar8;
                                      if (cVar1 != '\0') {
                                        pcVar8 = pcVar14 + 2;
                                        *pcVar13 = cVar1;
                                        pcVar13 = pcVar13 + 1;
                                      }
                                      for (; (cVar1 = *pcVar8, cVar1 != '\0' && (cVar1 != ']'));
                                          pcVar8 = pcVar8 + 1) {
                                      }
                                      pcVar8 = pcVar8 + (cVar1 == ']');
                                    }
                                    else if (cVar1 == '?') {
                                      *pcVar13 = '_';
                                      pcVar13 = pcVar13 + 1;
                                    }
                                    else {
                                      *pcVar13 = cVar1;
                                      pcVar13 = pcVar13 + 1;
                                    }
                                  }
                                  *pcVar13 = '\0';
                                  local_170 = create_section(script_obj,name,(uint8_t *)0x0,0);
                                  local_170->lnksec = ls;
                                  addtail(&ls->sections,&local_170->n);
                                }
                                skipblock(1,'(',')');
                              }
                              else {
                                uVar5 = getlineno();
                                error(0x41,pcVar13,(ulong)uVar5);
                                back(1);
                              }
                            }
                          }
                          cVar1 = getchr();
                        } while (cVar1 == ';');
                        back(1);
                        level = 1;
                        new_ls_name = (char *)0x0;
                        ppPVar10 = endofsecdef(gv,ls);
                        if (ppPVar10 == (Phdr **)0x0) {
                          if (ls->relocmem == (MemoryDescr *)0x0) {
                            ls->relocmem = vdefmem;
                          }
                          if (ls->destmem == (MemoryDescr *)0x0) {
                            ls->destmem = ldefmem;
                          }
                        }
                        else {
                          if (ls->relocmem == (MemoryDescr *)0x0) {
                            ls->relocmem = vdefmem;
                          }
                          if (ls->destmem == (MemoryDescr *)0x0) {
                            ls->destmem = ldefmem;
                          }
                          pPVar11 = *ppPVar10;
                          if (((pPVar11 == (Phdr *)0x0) &&
                              (__ptr = ppPVar10, local_168 != (Phdr **)0x0)) ||
                             ((ppPVar15 = local_168, pPVar11 != (Phdr *)0x0 &&
                              ((ppPVar15 = ppPVar10, local_168 != (Phdr **)0x0 &&
                               (bVar16 = ppPVar10 != local_168, __ptr = local_168,
                               local_168 = ppPVar10, bVar16)))))) {
                            free(__ptr);
                            pPVar11 = *local_168;
                            ppPVar10 = local_168;
                            ppPVar15 = local_168;
                          }
                          local_168 = ppPVar15;
                          if (pPVar11 == (Phdr *)0x0) {
                            lmreg = ls->destmem;
                            vmreg = ls->relocmem;
                            if (lmreg == vmreg && vmreg == defmem) {
                              use_segment(gv," text",1,defmem,defmem);
                              pcVar8 = " data";
                              vmreg = defmem;
                              lmreg = defmem;
                            }
                            else {
                              pcVar8 = " load";
                            }
                            use_segment(gv,pcVar8,1,vmreg,lmreg);
                            uVar2 = guess_special_segment(pcVar7,&local_150);
                            if (uVar2 != 0) {
                              use_segment(gv,local_150,(uint)uVar2,ls->relocmem,ls->destmem);
                            }
                          }
                          else {
                            do {
                              ppPVar10 = ppPVar10 + 1;
                              if (pPVar11->type != 0) {
                                *(byte *)&pPVar11->flags = (byte)pPVar11->flags | 0x10;
                              }
                              pPVar11 = *ppPVar10;
                            } while (pPVar11 != (Phdr *)0x0);
                          }
                        }
                      }
                    }
                  }
                }
                cVar1 = getchr();
              } while (cVar1 == ';');
              back(1);
              if (local_168 != (Phdr **)0x0) {
                free(local_168);
              }
              endofblock('{','}');
            }
            level = 0;
            bVar16 = true;
          }
          else {
            iVar3 = check_command(gv,pcVar7,2);
            if (iVar3 == 0) {
              cVar1 = getchr();
              pcVar8 = scriptname;
              if (cVar1 == '=') {
                symbol_assignment(gv,pcVar7,'\0');
              }
              else {
                uVar5 = getlineno();
                error(0x41,pcVar8,(ulong)uVar5);
                back(1);
              }
            }
          }
          goto LAB_00113774;
        }
        gv->use_ldscript = 1;
        if (bVar16) goto LAB_0011381c;
        bVar4 = startofblock('{');
      } while (bVar4 == 0);
      pcVar7 = getarg('\x01');
      while (pcVar7 != (char *)0x0) {
        strcpy((char *)&local_138,pcVar7);
        pcVar8 = getarg('\x01');
        pcVar7 = scriptname;
        if (pcVar8 == (char *)0x0) {
          uVar5 = getlineno();
          error(0x4e,pcVar7,(ulong)uVar5);
LAB_00113fbc:
          skipblock(1,'\0',';');
        }
        else {
          if (((*pcVar8 != 'P') || (pcVar8[1] != 'T')) || (pcVar8[2] != '_')) {
            uVar5 = getlineno();
            error(99,pcVar7,(ulong)uVar5);
            goto LAB_00113fbc;
          }
          switch(pcVar8[3]) {
          case 'I':
            local_170._0_4_ = 3;
            break;
          case 'J':
          case 'K':
          case 'M':
          case 'O':
          case 'Q':
          case 'R':
switchD_00113f67_caseD_4a:
            uVar5 = getlineno();
            local_170._0_4_ = 0;
            error(99,pcVar7,(ulong)uVar5,pcVar8);
            break;
          case 'L':
            local_170._0_4_ = 1;
            break;
          case 'N':
            local_170._0_4_ = 4;
            break;
          case 'P':
            local_170._0_4_ = 6;
            break;
          case 'S':
            local_170._0_4_ = 5;
            break;
          default:
            if (pcVar8[3] != 'D') goto switchD_00113f67_caseD_4a;
            local_170._0_4_ = 2;
          }
          pcVar7 = getarg('\x01');
          if (pcVar7 == (char *)0x0) {
            local_168 = (Phdr **)0xffffffffffffffff;
            uVar2 = 0;
          }
          else {
            local_168 = (Phdr **)0xffffffffffffffff;
            uVar5 = 0;
            do {
              iVar3 = strcmp(pcVar7,"FILEHDR");
              if (iVar3 == 0) {
                uVar5 = uVar5 | 0x800;
              }
              else {
                iVar3 = strcmp(pcVar7,"PHDRS");
                if (iVar3 == 0) {
                  uVar5 = uVar5 | 0x400;
                }
                else if (((*pcVar7 == 'A') && (pcVar7[1] == 'T')) && (pcVar7[2] == '\0')) {
                  local_168 = (Phdr **)term_absexp();
                  uVar5 = uVar5 | 0x80;
                }
                else {
                  iVar3 = strcmp(pcVar7,"FLAGS");
                  pcVar8 = scriptname;
                  if (iVar3 == 0) {
                    lVar12 = term_absexp();
                    uVar5 = uVar5 | (uint)lVar12 & 7 | 0x40;
                  }
                  else {
                    uVar6 = getlineno();
                    error(0x41,pcVar8,(ulong)uVar6,pcVar7);
                  }
                }
              }
              uVar2 = (uint16_t)uVar5;
              pcVar7 = getarg('\x01');
            } while (pcVar7 != (char *)0x0);
          }
          cVar1 = getchr();
          pcVar7 = scriptname;
          if (cVar1 != ';') {
            uVar5 = getlineno();
            error(0x42,pcVar7,(ulong)uVar5);
            if (cVar1 == '}') goto LAB_00113771;
          }
          add_phdr(gv,(char *)&local_138,(uint32_t)local_170,uVar2,(lword)local_168,
                   (MemoryDescr *)0x0,(MemoryDescr *)0x0);
        }
        pcVar7 = getarg('\x01');
      }
      endofblock('{','}');
      pPVar11 = gv->phdrlist;
    } while (pPVar11 == (Phdr *)0x0);
    bVar16 = false;
    do {
      if (pPVar11->type == 6) goto LAB_00113771;
      if ((pPVar11->flags & 0x400) != 0) {
        bVar16 = true;
      }
      pPVar11 = pPVar11->next;
    } while (pPVar11 != (Phdr *)0x0);
    if (bVar16) {
      add_phdr(gv," headers",6,0x400,-1,defmem,defmem);
    }
  } while( true );
joined_r0x00113e17:
  if (pcVar7 == (char *)0x0) goto LAB_00113eda;
  strcpy((char *)&local_138,pcVar7);
  cVar1 = getchr();
  if (cVar1 == '(') {
    skipblock(1,'(',')');
    cVar1 = getchr();
  }
  pcVar7 = scriptname;
  if (cVar1 == ':') {
    lVar12 = readmemparam(gv,"ORIGIN");
    cVar1 = getchr();
    pcVar7 = scriptname;
    if (cVar1 != ',') {
      uVar5 = getlineno();
      goto LAB_00113ec0;
    }
    len = readmemparam(gv,"LENGTH");
    add_memblock((char *)&local_138,lVar12,len);
  }
  else {
    uVar5 = getlineno();
LAB_00113ec0:
    error(0x42,pcVar7,(ulong)uVar5);
  }
  pcVar7 = getarg('\x01');
  goto joined_r0x00113e17;
LAB_00113eda:
  endofblock('{','}');
  goto LAB_00113771;
}

Assistant:

void init_ld_script(struct GlobalVars *gv)
{
  char c;

  if (!gv->dest_object) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->exeldscript;
  }
  else if (gv->dest_sharedobj) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->soldscript;
  }

  if (scriptbase) {
    bool secdef = FALSE;
    char *keyword;

    /* initialization */
    preparse = TRUE;
    current_ls = NULL;
    level = 0; /* outside SECTIONS block */
    defmem = vdefmem = ldefmem = add_memblock(defmemname,MEM_DEFORG,MEM_DEFLEN);
    atdefmem = add_memblock("lmadefault",MEM_DEFORG,MEM_DEFLEN);
    change_address(defmem,gv->start_addr);
    if (!(scriptname = gv->scriptname))
      scriptname = "built-in script";
    script_obj = make_ld_objunit(gv);

    /* pre-parse script: get memory-regions and symbol definitions */
    init_parser(gv,scriptname,scriptbase,1);

    do {
      while (keyword = getword()) {

        if (!strcmp(keyword,"MEMORY")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_memory(gv);
          }
          else {
            /* MEMORY behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"PHDRS")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_phdrs(gv);
          }
          else {
            /* PHDRS behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"SECTIONS")) {
          gv->use_ldscript = TRUE;
          if (secdef)
            error(74,scriptname,getlineno());  /* SECTIONS block def. twice */
          else
            secdef = TRUE;

          /* Define default PHDRs */
          if (gv->phdrlist == NULL) {
            add_phdr(gv,deftxt,PT_LOAD,PHDR_FLAGS|PF_X|PF_R,
                     ADDR_NONE,defmem,defmem);
            add_phdr(gv,defdat,PT_LOAD,PHDR_FLAGS|PF_R|PF_W,
                     ADDR_NONE,defmem,defmem);
          }
          level = 1;
          predefine_sections(gv);
          level = 0;
        }

        else {
          if (check_command(gv,keyword,SCMDF_GLOBAL)) {
            /* script-command executed */
            continue;
          }

          else if (getchr() == '=') {
            /* symbol assignment */
            symbol_assignment(gv,keyword,0);
          }

          else {
            /* unknown keyword ignored */
            error(65,scriptname,getlineno(),keyword);
            back(1);
          }
        }
      }
    }
    while ((c = getchr()) == ';');

    if (c) {
      back(1);
      error(78,scriptname,getlineno());   /* missing argument */
    }
    preparse = FALSE;
  }
}